

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertexClustering.cpp
# Opt level: O0

void __thiscall VertexClustering::computeClusters(VertexClustering *this,bool constrain)

{
  double dVar1;
  bool bVar2;
  reference pvVar3;
  clock_t cVar4;
  byte in_SIL;
  queue<VCEdge,_std::deque<VCEdge,_std::allocator<VCEdge>_>_> *in_RDI;
  pair<std::_Rb_tree_const_iterator<VCEdge>,_bool> pVar5;
  VCCluster *c2;
  VCCluster *c1;
  VCEdge e;
  set<VCEdge,_VCEdgeItemCmp,_std::allocator<VCEdge>_> tested;
  clock_t start;
  int iteration;
  int modification;
  queue<VCEdge,_std::deque<VCEdge,_std::allocator<VCEdge>_>_> *q2;
  queue<VCEdge,_std::deque<VCEdge,_std::allocator<VCEdge>_>_> *q1;
  queue<VCEdge,_std::deque<VCEdge,_std::allocator<VCEdge>_>_> boundary_next;
  queue<VCEdge,_std::deque<VCEdge,_std::allocator<VCEdge>_>_> *in_stack_fffffffffffffe98;
  undefined7 in_stack_fffffffffffffea0;
  undefined1 in_stack_fffffffffffffea7;
  set<VCEdge,_VCEdgeItemCmp,_std::allocator<VCEdge>_> *in_stack_fffffffffffffea8;
  undefined6 in_stack_fffffffffffffeb0;
  undefined1 in_stack_fffffffffffffeb6;
  undefined1 in_stack_fffffffffffffeb7;
  _Rb_tree_const_iterator<VCEdge> in_stack_fffffffffffffeb8;
  iterator in_stack_fffffffffffffec0;
  bool local_131;
  queue<VCEdge,_std::deque<VCEdge,_std::allocator<VCEdge>_>_> *pqVar6;
  VCEdge *e_00;
  _Self local_e8;
  _Self local_e0;
  VCEdge local_d8 [5];
  clock_t local_80;
  uint local_78;
  uint local_74;
  queue<VCEdge,_std::deque<VCEdge,_std::allocator<VCEdge>_>_> *local_70;
  size_t *local_68;
  queue<VCEdge,_std::deque<VCEdge,_std::allocator<VCEdge>_>_> local_60;
  byte local_9;
  
  local_9 = in_SIL & 1;
  pqVar6 = &local_60;
  std::queue<VCEdge,std::deque<VCEdge,std::allocator<VCEdge>>>::
  queue<std::deque<VCEdge,std::allocator<VCEdge>>,void>
            ((queue<VCEdge,_std::deque<VCEdge,_std::allocator<VCEdge>_>_> *)
             CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0));
  local_68 = &in_RDI[1].c.super__Deque_base<VCEdge,_std::allocator<VCEdge>_>._M_impl.
              super__Deque_impl_data._M_map_size;
  local_78 = 0;
  local_70 = pqVar6;
  local_80 = clock();
  e_00 = (VCEdge *)
         totalEnergy((VertexClustering *)
                     CONCAT17(in_stack_fffffffffffffeb7,
                              CONCAT16(in_stack_fffffffffffffeb6,in_stack_fffffffffffffeb0)));
  printf("---start clustering, with total energy: %.12lf---\n",(int)e_00);
  do {
    local_74 = 0;
    std::set<VCEdge,_VCEdgeItemCmp,_std::allocator<VCEdge>_>::set
              ((set<VCEdge,_VCEdgeItemCmp,_std::allocator<VCEdge>_> *)0x281ce2);
    while (bVar2 = std::queue<VCEdge,_std::deque<VCEdge,_std::allocator<VCEdge>_>_>::empty
                             ((queue<VCEdge,_std::deque<VCEdge,_std::allocator<VCEdge>_>_> *)
                              0x281cef), ((bVar2 ^ 0xffU) & 1) != 0) {
      pvVar3 = std::queue<VCEdge,_std::deque<VCEdge,_std::allocator<VCEdge>_>_>::front
                         ((queue<VCEdge,_std::deque<VCEdge,_std::allocator<VCEdge>_>_> *)0x281d11);
      local_d8[0].f1 = pvVar3->f1;
      local_d8[0].f2 = pvVar3->f2;
      std::queue<VCEdge,_std::deque<VCEdge,_std::allocator<VCEdge>_>_>::pop
                ((queue<VCEdge,_std::deque<VCEdge,_std::allocator<VCEdge>_>_> *)0x281d35);
      bVar2 = VCEdge::isBoundary(local_d8);
      local_131 = false;
      if (bVar2) {
        in_stack_fffffffffffffec0 =
             std::set<VCEdge,_VCEdgeItemCmp,_std::allocator<VCEdge>_>::find
                       (in_stack_fffffffffffffea8,
                        (key_type *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0));
        local_e0._M_node = in_stack_fffffffffffffec0._M_node;
        local_e8._M_node =
             (_Base_ptr)
             std::set<VCEdge,_VCEdgeItemCmp,_std::allocator<VCEdge>_>::end
                       ((set<VCEdge,_VCEdgeItemCmp,_std::allocator<VCEdge>_> *)
                        in_stack_fffffffffffffe98);
        local_131 = std::operator==(&local_e0,&local_e8);
      }
      if (local_131 != false) {
        pVar5 = std::set<VCEdge,_VCEdgeItemCmp,_std::allocator<VCEdge>_>::insert
                          ((set<VCEdge,_VCEdgeItemCmp,_std::allocator<VCEdge>_> *)
                           in_stack_fffffffffffffec0._M_node,
                           (value_type *)in_stack_fffffffffffffeb8._M_node);
        in_stack_fffffffffffffeb8 = pVar5.first._M_node;
        in_stack_fffffffffffffeb7 = pVar5.second;
        in_stack_fffffffffffffeb6 =
             localEnergyRelease((VertexClustering *)in_stack_fffffffffffffeb8._M_node,
                                (local_d8[0].f1)->cluster,(local_d8[0].f2)->cluster,e_00,in_RDI,
                                SUB81((ulong)pqVar6 >> 0x38,0));
        if ((bool)in_stack_fffffffffffffeb6) {
          local_74 = local_74 + 1;
        }
      }
    }
    local_78 = local_78 + 1;
    printf("iteration: %d, modification: %d, ",(ulong)local_78,(ulong)local_74);
    in_stack_fffffffffffffea8 =
         (set<VCEdge,_VCEdgeItemCmp,_std::allocator<VCEdge>_> *)
         totalEnergy((VertexClustering *)
                     CONCAT17(in_stack_fffffffffffffeb7,
                              CONCAT16(in_stack_fffffffffffffeb6,in_stack_fffffffffffffeb0)));
    printf("total energy: %.12lf\n",(int)in_stack_fffffffffffffea8);
    std::swap<std::queue<VCEdge,std::deque<VCEdge,std::allocator<VCEdge>>>*>
              ((queue<VCEdge,_std::deque<VCEdge,_std::allocator<VCEdge>_>_> **)&local_68,&local_70);
    std::set<VCEdge,_VCEdgeItemCmp,_std::allocator<VCEdge>_>::~set
              ((set<VCEdge,_VCEdgeItemCmp,_std::allocator<VCEdge>_> *)0x281f1c);
  } while (0 < (int)local_74);
  bVar2 = std::queue<VCEdge,_std::deque<VCEdge,_std::allocator<VCEdge>_>_>::empty
                    ((queue<VCEdge,_std::deque<VCEdge,_std::allocator<VCEdge>_>_> *)0x281f38);
  if (bVar2) {
    std::queue<VCEdge,_std::deque<VCEdge,_std::allocator<VCEdge>_>_>::operator=
              ((queue<VCEdge,_std::deque<VCEdge,_std::allocator<VCEdge>_>_> *)
               CONCAT17(bVar2,in_stack_fffffffffffffea0),in_stack_fffffffffffffe98);
  }
  cVar4 = clock();
  printf("Done, uses %lf s for clustering.\n",SUB84((double)(cVar4 - local_80) / 1000000.0,0));
  dVar1 = totalEnergy((VertexClustering *)
                      CONCAT17(in_stack_fffffffffffffeb7,
                               CONCAT16(in_stack_fffffffffffffeb6,in_stack_fffffffffffffeb0)));
  printf("---total energy: %.12lf---\n",SUB84(dVar1,0));
  std::queue<VCEdge,_std::deque<VCEdge,_std::allocator<VCEdge>_>_>::~queue
            ((queue<VCEdge,_std::deque<VCEdge,_std::allocator<VCEdge>_>_> *)0x281fc6);
  return;
}

Assistant:

void VertexClustering::computeClusters(bool constrain)
{
	queue<VCEdge> boundary_next;
	queue<VCEdge> *q1 = &boundary, *q2 = &boundary_next;
	int modification;
	int iteration = 0;
	clock_t start = clock();
	printf("---start clustering, with total energy: %.12lf---\n", totalEnergy());
	do {
		modification = 0;
		set<VCEdge, VCEdgeItemCmp> tested;
		while (!q1->empty()) {
			VCEdge e = q1->front();
			q1->pop();
			if (e.isBoundary() && tested.find(e) == tested.end()) {
				tested.insert(e);
				VCCluster *c1 = e.f1->cluster;
				VCCluster *c2 = e.f2->cluster;
				if (localEnergyRelease(c1, c2, e, q2, constrain)) {
					modification++;
				}
			}
		}
		printf("iteration: %d, modification: %d, ", ++iteration, modification);
		printf("total energy: %.12lf\n", totalEnergy());
		std::swap(q1, q2);
	} while (modification > 0);
	if (boundary.empty())
		boundary = boundary_next;

	printf("Done, uses %lf s for clustering.\n", (double)(clock() - start) / CLOCKS_PER_SEC);
	printf("---total energy: %.12lf---\n", totalEnergy());
}